

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void __thiscall ON_RTreeMemPool::GrowBuffer(ON_RTreeMemPool *this)

{
  size_t sVar1;
  Blk *pBVar2;
  
  if ((this->m_sizeof_blk == 0) ||
     ((this->m_blk_list != (Blk *)0x0 && (this->m_blk_list->m_next == (Blk *)0x0)))) {
    this->m_sizeof_blk = 0x2f18;
  }
  pBVar2 = (Blk *)onmalloc(this->m_sizeof_blk);
  if (pBVar2 != (Blk *)0x0) {
    sVar1 = this->m_sizeof_blk;
    this->m_sizeof_heap = this->m_sizeof_heap + sVar1;
    pBVar2->m_next = this->m_blk_list;
    this->m_blk_list = pBVar2;
    this->m_buffer = (uchar *)(pBVar2 + 2);
    this->m_buffer_capacity = sVar1 - 0x10;
    return;
  }
  this->m_buffer = (uchar *)0x0;
  this->m_buffer_capacity = 0;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
             ,0xdf,"","ON_RTreeMemPool::GrowBuffer - out of memory");
  return;
}

Assistant:

void ON_RTreeMemPool::GrowBuffer()
{
  if ( (0 == m_sizeof_blk) || (0 != m_blk_list && 0 == m_blk_list->m_next) )
  {
    // Setting m_sizeof_blk happens twice per ON_RTreeMemPool.
    // The first time is typically at construction and not here.
    // The (0 == m_sizeof_blk) check is here to support cases 
    // where the ON_RTreeMemPool class is initialized by a "memset(...,0)
    // instead of calling its constructor.  The first block can be small
    // if the caller passed in a leaf_count estimate.  For the second
    // (0 != m_blk_list && 0 == m_blk_list->m_next) and subsequent calls
    // to GrowBuffer(), we use the default block size.
    m_sizeof_blk = MemPoolBlkSize(0); 
  }

  struct Blk* blk = (struct Blk*)onmalloc(m_sizeof_blk);
  if ( blk )
  {
    m_sizeof_heap += m_sizeof_blk;
    blk->m_next = m_blk_list;
    m_blk_list = blk;
    const size_t sizeof_blklink = SizeofBlkLink();
    m_buffer = ((unsigned char*)m_blk_list) + sizeof_blklink;
    m_buffer_capacity = m_sizeof_blk - sizeof_blklink;
  }
  else
  {
    m_buffer = 0;
    m_buffer_capacity = 0;
    ON_ERROR("ON_RTreeMemPool::GrowBuffer - out of memory");
  }
}